

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.h
# Opt level: O0

void __thiscall haVoc::Moveorder::~Moveorder(Moveorder *this)

{
  Moveorder *this_local;
  
  ~Moveorder(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

virtual ~Moveorder() { }